

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::
Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::StringLengthCompare>_>
::Impl<1UL,_false>::insert
          (Impl<1UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,StringPtr *row,uint skip)

{
  StringPtr **this_00;
  RemoveConst<kj::StringPtr> **ppRVar1;
  uint uVar2;
  StringPtr *pSVar3;
  size_t sVar4;
  HashBucket *pHVar5;
  uint uVar6;
  long lVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  char **ppcVar9;
  uint uVar10;
  ArrayDisposer *pAVar11;
  undefined4 in_register_00000084;
  char **ppcVar12;
  Maybe<unsigned_long> MVar13;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  bool local_71;
  StringPtr *local_70;
  size_t local_68;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
  local_60;
  
  if (skip != 1) {
    pSVar3 = (table->rows).builder.ptr;
    lVar7 = (long)(table->rows).builder.pos - (long)pSVar3 >> 4;
    sVar4 = (row->content).size_;
    pHVar5 = (HashBucket *)table[1].rows.builder.disposer;
    local_70 = row;
    local_68 = pos;
    if ((ulong)((long)pHVar5 * 2) <
        ((long)&((table[1].rows.builder.pos)->content).ptr + lVar7) * 3 + 3U) {
      this_00 = &table[1].rows.builder.endPtr;
      oldBuckets.size_ = lVar7 * 3 + 3;
      oldBuckets.ptr = pHVar5;
      _::rehash((Array<kj::_::HashBucket> *)&local_60,(_ *)*this_00,oldBuckets,
                CONCAT44(in_register_00000084,skip));
      Array<kj::_::HashBucket>::operator=
                ((Array<kj::_::HashBucket> *)this_00,(Array<kj::_::HashBucket> *)&local_60);
      Array<kj::_::HashBucket>::~Array((Array<kj::_::HashBucket> *)&local_60);
      table[1].rows.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
    }
    uVar6 = _::intHash64(sVar4 - 1);
    aVar8 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            table[1].rows.builder.disposer;
    uVar10 = (int)aVar8.value - 1U & uVar6;
    ppcVar9 = (char **)0x0;
LAB_0016202a:
    ppcVar12 = &((table[1].rows.builder.endPtr)->content).ptr + uVar10;
    uVar2 = *(uint *)((long)ppcVar12 + 4);
    if (uVar2 == 1) {
      if (ppcVar9 == (char **)0x0) {
        ppcVar9 = ppcVar12;
      }
    }
    else {
      if (uVar2 == 0) {
        if (ppcVar9 != (char **)0x0) {
          ppRVar1 = &table[1].rows.builder.pos;
          *ppRVar1 = (RemoveConst<kj::StringPtr> *)((long)&(*ppRVar1)[-1].content.size_ + 7);
          ppcVar12 = ppcVar9;
        }
        *ppcVar12 = (char *)(((ulong)uVar6 | pos << 0x20) + 0x200000000);
        local_60.maybeFunc.ptr.isSet = true;
        local_60.maybeFunc.ptr.field_1.value.success = &local_71;
        local_60.maybeFunc.ptr.field_1.value.pos = &local_68;
        local_60.maybeFunc.ptr.field_1.value.row = local_70;
        *this = (Impl<1UL,_false>)0x0;
        local_71 = true;
        local_60.maybeFunc.ptr.field_1.value.indexObj =
             (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(table + 1);
        local_60.maybeFunc.ptr.field_1.value.table = table;
        _::
        Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
        ::~Deferred(&local_60);
        aVar8 = extraout_RDX;
        goto LAB_001620cf;
      }
      if ((*(uint *)ppcVar12 == uVar6) && (pSVar3[uVar2 - 2].content.size_ == sVar4))
      goto LAB_001620c8;
    }
    pAVar11 = (ArrayDisposer *)((ulong)uVar10 + 1);
    uVar10 = (uint)pAVar11;
    if (pAVar11 == (ArrayDisposer *)aVar8.value) {
      uVar10 = 0;
    }
    goto LAB_0016202a;
  }
  *this = (Impl<1UL,_false>)0x0;
  aVar8 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)pos;
LAB_001620cf:
  MVar13.ptr.field_1.value = aVar8.value;
  MVar13.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar13.ptr;
LAB_001620c8:
  *this = (Impl<1UL,_false>)0x1;
  *(ulong *)(this + 8) = (ulong)(uVar2 - 2);
  goto LAB_001620cf;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }